

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocumentUtil.cpp
# Opt level: O1

shared_ptr<const_Assimp::FBX::PropertyTable> __thiscall
Assimp::FBX::Util::GetPropertyTable
          (Util *this,Document *doc,string *templateName,Element *element,Scope *sc,bool no_warn)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  const_iterator cVar2;
  const_iterator cVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  Element *__args;
  shared_ptr<const_Assimp::FBX::PropertyTable> sVar5;
  shared_ptr<const_Assimp::FBX::PropertyTable> templateProps;
  key_type local_68;
  shared_ptr<const_Assimp::FBX::PropertyTable> local_48;
  Element *local_38;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Properties70","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                  *)sc,&local_68);
  if ((_Rb_tree_header *)cVar2._M_node == &(sc->elements)._M_t._M_impl.super__Rb_tree_header) {
    __args = (Element *)0x0;
  }
  else {
    __args = *(Element **)(cVar2._M_node + 2);
  }
  local_38 = element;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  this_00 = &local_48.
             super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  local_48.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::FBX::PropertyTable_const*>
            (this_00,(PropertyTable *)0x0);
  _Var4._M_pi = extraout_RDX;
  if (templateName->_M_string_length != 0) {
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
            ::find(&(doc->templates)._M_t,templateName);
    _Var4._M_pi = extraout_RDX_00;
    if ((_Rb_tree_header *)cVar3._M_node != &(doc->templates)._M_t._M_impl.super__Rb_tree_header) {
      local_48.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = *(element_type **)(cVar3._M_node + 2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cVar3._M_node[2]._M_parent);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  if ((__args == (Element *)0x0) ||
     ((__args->compound)._M_t.
      super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
      super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
      super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl == (Scope *)0x0)) {
    if (!no_warn) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"property table (Properties70) not found","");
      DOMWarning(&local_68,local_38->key_token);
      _Var4._M_pi = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        _Var4._M_pi = extraout_RDX_04;
      }
    }
    _Var1._M_pi = local_48.
                  super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (local_48.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      *(undefined8 *)this = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Assimp::FBX::PropertyTable_const,std::allocator<Assimp::FBX::PropertyTable>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(PropertyTable **)this,
                 (allocator<Assimp::FBX::PropertyTable> *)&local_68);
      _Var4._M_pi = extraout_RDX_05;
    }
    else {
      *(element_type **)this =
           local_48.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      *(undefined8 *)(this + 8) = 0;
      local_48.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
      local_48.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
    }
  }
  else {
    *(undefined8 *)this = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Assimp::FBX::PropertyTable_const,std::allocator<Assimp::FBX::PropertyTable>,Assimp::FBX::Element_const&,std::shared_ptr<Assimp::FBX::PropertyTable_const>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(PropertyTable **)this,
               (allocator<Assimp::FBX::PropertyTable> *)&local_68,__args,&local_48);
    _Var4._M_pi = extraout_RDX_02;
  }
  if (local_48.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_06;
  }
  sVar5.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FBX::PropertyTable>)
         sVar5.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const PropertyTable> GetPropertyTable(const Document& doc,
    const std::string& templateName,
    const Element &element,
    const Scope& sc,
    bool no_warn /*= false*/)
{
    const Element* const Properties70 = sc["Properties70"];
    std::shared_ptr<const PropertyTable> templateProps = std::shared_ptr<const PropertyTable>(
        static_cast<const PropertyTable*>(NULL));

    if(templateName.length()) {
        PropertyTemplateMap::const_iterator it = doc.Templates().find(templateName);
        if(it != doc.Templates().end()) {
            templateProps = (*it).second;
        }
    }

    if(!Properties70 || !Properties70->Compound()) {
        if(!no_warn) {
            DOMWarning("property table (Properties70) not found",&element);
        }
        if(templateProps) {
            return templateProps;
        }
        else {
            return std::make_shared<const PropertyTable>();
        }
    }
    return std::make_shared<const PropertyTable>(*Properties70,templateProps);
}